

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::scoped_pad::scoped_pad
          (scoped_pad *this,size_t wrapped_size,padding_info *padinfo,memory_buffer *dest)

{
  ulong count;
  
  this->padinfo_ = padinfo;
  this->dest_ = dest;
  (this->spaces_)._M_len = 0x80;
  (this->spaces_)._M_str =
       "                                                                                                                                "
  ;
  count = padinfo->width_ - wrapped_size;
  if (wrapped_size <= padinfo->width_ && count != 0) {
    this->total_pad_ = count;
    if (padinfo->side_ == center) {
      pad_it(this,count >> 1);
      this->total_pad_ = (ulong)((uint)count & 1) + (count >> 1);
      return;
    }
    if (padinfo->side_ != left) {
      return;
    }
    pad_it(this,count);
  }
  this->total_pad_ = 0;
  return;
}

Assistant:

scoped_pad(size_t wrapped_size, padding_info &padinfo, fmt::memory_buffer &dest)
        : padinfo_(padinfo)
        , dest_(dest)
    {

        if (padinfo_.width_ <= wrapped_size)
        {
            total_pad_ = 0;
            return;
        }

        total_pad_ = padinfo.width_ - wrapped_size;
        if (padinfo_.side_ == padding_info::left)
        {
            pad_it(total_pad_);
            total_pad_ = 0;
        }
        else if (padinfo_.side_ == padding_info::center)
        {
            auto half_pad = total_pad_ / 2;
            auto reminder = total_pad_ & 1;
            pad_it(half_pad);
            total_pad_ = half_pad + reminder; // for the right side
        }
    }